

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDVertex::FaceArrayIndex(ON_SubDVertex *this,ON_SubDFace *face)

{
  uint i;
  ulong uVar1;
  
  if ((face != (ON_SubDFace *)0x0) && ((ulong)this->m_face_count != 0)) {
    if (this->m_faces == (ON_SubDFace **)0x0) {
      ON_SubDIncrementErrorCount();
    }
    else {
      uVar1 = 0;
      do {
        if (this->m_faces[uVar1] == face) {
          return (uint)uVar1;
        }
        uVar1 = uVar1 + 1;
      } while (this->m_face_count != uVar1);
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned int ON_SubDVertex::FaceArrayIndex(
  const ON_SubDFace* face
  ) const
{
  if ( nullptr == face )
    return ON_UNSET_UINT_INDEX;
  const unsigned int face_count = m_face_count;
  if ( 0 == face_count)
    return ON_UNSET_UINT_INDEX;
  if ( nullptr == m_faces)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_UINT_INDEX);

  for ( unsigned int i = 0; i < face_count; i++)
  {
    if (face == m_faces[i] )
      return i;
  }

  return ON_UNSET_UINT_INDEX;
}